

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O0

Literal __thiscall Clasp::Solver::defaultLit(Solver *this,Var v)

{
  bool bVar1;
  Var in_ESI;
  Solver *in_RDI;
  double dVar2;
  Flag in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  Literal local_4;
  
  switch(SUB84(in_RDI->strategy_,4) >> 0x15 & 3) {
  default:
    varInfo(in_RDI,in_ESI);
    bVar1 = VarInfo::has((VarInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
    Literal::Literal(&local_4,in_ESI,(bool)((bVar1 ^ 0xffU) & 1));
    break;
  case 1:
    local_4 = posLit(0x1f64ad);
    break;
  case 2:
    local_4 = negLit(0x1f64bc);
    break;
  case 3:
    dVar2 = RNG::drand((RNG *)0x1f64d4);
    Literal::Literal(&local_4,in_ESI,dVar2 < 0.5);
  }
  return (Literal)local_4.rep_;
}

Assistant:

inline Literal Solver::defaultLit(Var v) const {
	switch(strategy_.signDef) {
		default: //
		case SolverStrategies::sign_atom: return Literal(v, !varInfo(v).has(VarInfo::Body));
		case SolverStrategies::sign_pos : return posLit(v);
		case SolverStrategies::sign_neg : return negLit(v);
		case SolverStrategies::sign_rnd : return Literal(v, rng.drand() < 0.5);
	}
}